

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int rc_pick_q_and_bounds_no_stats
              (AV1_COMP *cpi,int width,int height,int *bottom_index,int *top_index)

{
  int iVar1;
  PRIMARY_RATE_CONTROL *p_rc_00;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  AV1_COMP *in_RDI;
  int *in_R8;
  int qdelta;
  int delta_qindex_3;
  double delta_rate [16];
  double q_val_3;
  int qindex_3;
  int delta_qindex_2;
  double q_val_2;
  int qindex_2;
  double q_val_1;
  double q_adj_factor;
  int delta_qindex_1;
  double last_boosted_q;
  int qindex_1;
  int delta_qindex;
  double q_val;
  int qindex;
  int *inter_minq;
  int q;
  int active_worst_quality;
  int active_best_quality;
  int bit_depth;
  int cq_level;
  aom_rc_mode rc_mode;
  RefreshFrameInfo *refresh_frame;
  AV1EncoderConfig *oxcf;
  CurrentFrame *current_frame;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  AV1_COMMON *cm;
  aom_bit_depth_t in_stack_fffffffffffffe68;
  aom_bit_depth_t in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  aom_bit_depth_t in_stack_fffffffffffffe78;
  aom_bit_depth_t in_stack_fffffffffffffe7c;
  aom_bit_depth_t in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  aom_bit_depth_t in_stack_fffffffffffffe88;
  aom_bit_depth_t in_stack_fffffffffffffe8c;
  FRAME_TYPE frame_type;
  aom_bit_depth_t in_stack_fffffffffffffe90;
  aom_bit_depth_t aVar2;
  int local_150;
  undefined1 local_148 [128];
  double local_c8;
  aom_bit_depth_t local_c0;
  int local_bc;
  double local_b8;
  aom_bit_depth_t local_ac;
  double local_a8;
  double local_a0;
  int local_94;
  double local_90;
  int local_88;
  int local_84;
  double local_80;
  aom_bit_depth_t local_74;
  int *local_70;
  aom_bit_depth_t local_68;
  int local_64;
  aom_bit_depth_t local_60;
  aom_bit_depth_t local_5c;
  aom_bit_depth_t local_58;
  aom_rc_mode local_54;
  RefreshFrameInfo *local_50;
  AV1EncoderConfig *local_48;
  AV1_COMMON *local_40;
  PRIMARY_RATE_CONTROL *local_38;
  RATE_CONTROL *local_30;
  AV1_COMMON *local_28;
  int *local_20;
  int *local_18;
  int local_10;
  int local_c;
  AV1_COMP *local_8;
  
  local_40 = &in_RDI->common;
  p_rc_00 = &in_RDI->ppi->p_rc;
  local_50 = &in_RDI->refresh_frame;
  local_54 = (in_RDI->oxcf).rc_cfg.mode;
  local_48 = &in_RDI->oxcf;
  local_38 = p_rc_00;
  local_30 = &in_RDI->rc;
  local_28 = local_40;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  iVar1 = frame_is_intra_only(local_40);
  local_58 = get_active_cq_level(&in_RDI->rc,p_rc_00,&in_RDI->oxcf,iVar1,local_8->superres_mode,
                                 (uint)local_28->superres_scale_denominator);
  local_5c = local_28->seq_params->bit_depth;
  local_64 = calc_active_worst_quality_no_stats_vbr(local_8);
  if (local_5c == AOM_BITS_8) {
    local_70 = inter_minq_8;
  }
  else if (local_5c == AOM_BITS_10) {
    local_70 = inter_minq_10;
  }
  else if (local_5c == AOM_BITS_12) {
    local_70 = inter_minq_12;
  }
  else {
    local_70 = (int *)0x0;
  }
  aVar2 = local_5c;
  iVar1 = frame_is_intra_only(local_28);
  if (iVar1 == 0) {
    if ((local_30->is_src_frame_alt_ref == 0) &&
       (((local_50->golden_frame & 1U) != 0 || ((local_50->alt_ref_frame & 1U) != 0)))) {
      if ((local_30->frames_since_key < 2) || (local_64 <= local_38->avg_frame_qindex[1])) {
        in_stack_fffffffffffffe88 = local_38->avg_frame_qindex[0];
      }
      else {
        in_stack_fffffffffffffe88 = local_38->avg_frame_qindex[1];
      }
      local_68 = in_stack_fffffffffffffe88;
      if (local_54 == AOM_CQ) {
        if ((int)in_stack_fffffffffffffe88 < (int)local_58) {
          local_68 = local_58;
        }
        iVar1 = get_gf_active_quality
                          ((PRIMARY_RATE_CONTROL *)
                           CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                           in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
        local_60 = (iVar1 * 0xf) / 0x10;
      }
      else if (local_54 == AOM_Q) {
        local_ac = local_58;
        local_b8 = av1_convert_qindex_to_q(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
        if ((local_50->alt_ref_frame & 1U) == 0) {
          in_stack_fffffffffffffe84 =
               av1_compute_qdelta((RATE_CONTROL *)
                                  CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                  (double)CONCAT44(in_stack_fffffffffffffe7c,
                                                   in_stack_fffffffffffffe78),
                                  (double)CONCAT44(in_stack_fffffffffffffe74,
                                                   in_stack_fffffffffffffe70),
                                  in_stack_fffffffffffffe6c);
        }
        else {
          in_stack_fffffffffffffe84 =
               av1_compute_qdelta((RATE_CONTROL *)
                                  CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                  (double)CONCAT44(in_stack_fffffffffffffe7c,
                                                   in_stack_fffffffffffffe78),
                                  (double)CONCAT44(in_stack_fffffffffffffe74,
                                                   in_stack_fffffffffffffe70),
                                  in_stack_fffffffffffffe6c);
        }
        local_bc = in_stack_fffffffffffffe84;
        if (local_30->best_quality < (int)(local_ac + in_stack_fffffffffffffe84)) {
          in_stack_fffffffffffffe80 = local_ac + in_stack_fffffffffffffe84;
          local_60 = in_stack_fffffffffffffe80;
        }
        else {
          in_stack_fffffffffffffe80 = local_30->best_quality;
          local_60 = in_stack_fffffffffffffe80;
        }
      }
      else {
        local_60 = get_gf_active_quality
                             ((PRIMARY_RATE_CONTROL *)
                              CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                              in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
      }
    }
    else if (local_54 == AOM_Q) {
      local_c0 = local_58;
      local_c8 = av1_convert_qindex_to_q(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
      memcpy(local_148,&DAT_00ba2440,0x80);
      iVar1 = av1_compute_qdelta((RATE_CONTROL *)
                                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                 (double)CONCAT44(in_stack_fffffffffffffe7c,
                                                  in_stack_fffffffffffffe78),
                                 (double)CONCAT44(in_stack_fffffffffffffe74,
                                                  in_stack_fffffffffffffe70),
                                 in_stack_fffffffffffffe6c);
      if (local_30->best_quality < (int)(local_c0 + iVar1)) {
        in_stack_fffffffffffffe7c = local_c0 + iVar1;
        local_60 = in_stack_fffffffffffffe7c;
      }
      else {
        in_stack_fffffffffffffe7c = local_30->best_quality;
        local_60 = in_stack_fffffffffffffe7c;
      }
    }
    else {
      if ((local_40->current_frame).frame_number < 2) {
        in_stack_fffffffffffffe78 = local_70[local_38->avg_frame_qindex[0]];
      }
      else {
        in_stack_fffffffffffffe78 = local_70[local_38->avg_frame_qindex[1]];
      }
      local_60 = in_stack_fffffffffffffe78;
      if ((local_54 == AOM_CQ) && ((int)in_stack_fffffffffffffe78 < (int)local_58)) {
        local_60 = local_58;
      }
    }
  }
  else if (local_54 == AOM_Q) {
    local_74 = local_58;
    local_80 = av1_convert_qindex_to_q(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
    local_84 = av1_compute_qdelta((RATE_CONTROL *)
                                  CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                  (double)CONCAT44(in_stack_fffffffffffffe7c,
                                                   in_stack_fffffffffffffe78),
                                  (double)CONCAT44(in_stack_fffffffffffffe74,
                                                   in_stack_fffffffffffffe70),
                                  in_stack_fffffffffffffe6c);
    if (local_30->best_quality < (int)(local_74 + local_84)) {
      in_stack_fffffffffffffe90 = local_74 + local_84;
      local_60 = in_stack_fffffffffffffe90;
    }
    else {
      in_stack_fffffffffffffe90 = local_30->best_quality;
      local_60 = in_stack_fffffffffffffe90;
    }
  }
  else if (local_38->this_key_frame_forced == 0) {
    local_a0 = 1.0;
    local_60 = get_kf_active_quality
                         ((PRIMARY_RATE_CONTROL *)
                          CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                          in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
    if (local_c * local_10 < 0x18c01) {
      local_a0 = local_a0 - 0.25;
    }
    local_a8 = av1_convert_qindex_to_q(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
    iVar1 = av1_compute_qdelta((RATE_CONTROL *)
                               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                               (double)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                               ,(double)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70
                                                ),in_stack_fffffffffffffe6c);
    local_60 = iVar1 + local_60;
  }
  else {
    local_88 = local_38->last_boosted_qindex;
    local_90 = av1_convert_qindex_to_q(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68);
    local_94 = av1_compute_qdelta((RATE_CONTROL *)
                                  CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                  (double)CONCAT44(in_stack_fffffffffffffe7c,
                                                   in_stack_fffffffffffffe78),
                                  (double)CONCAT44(in_stack_fffffffffffffe74,
                                                   in_stack_fffffffffffffe70),
                                  in_stack_fffffffffffffe6c);
    if (local_30->best_quality < local_88 + local_94) {
      in_stack_fffffffffffffe8c = local_88 + local_94;
      local_60 = in_stack_fffffffffffffe8c;
    }
    else {
      in_stack_fffffffffffffe8c = local_30->best_quality;
      local_60 = in_stack_fffffffffffffe8c;
    }
  }
  local_60 = clamp(local_60,local_30->best_quality,local_30->worst_quality);
  local_64 = clamp(local_64,local_60,local_30->worst_quality);
  *local_20 = local_64;
  *local_18 = local_60;
  local_150 = 0;
  frame_type = (FRAME_TYPE)(in_stack_fffffffffffffe8c >> 0x18);
  if ((((local_40->current_frame).frame_type == '\0') && (local_38->this_key_frame_forced == 0)) &&
     ((local_40->current_frame).frame_number != 0)) {
    local_150 = av1_compute_qdelta_by_rate
                          ((AV1_COMP *)CONCAT44(aVar2,in_stack_fffffffffffffe90),frame_type,
                           in_stack_fffffffffffffe88,
                           (double)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  }
  else if ((local_30->is_src_frame_alt_ref == 0) &&
          (((local_50->golden_frame & 1U) != 0 || ((local_50->alt_ref_frame & 1U) != 0)))) {
    local_150 = av1_compute_qdelta_by_rate
                          ((AV1_COMP *)CONCAT44(aVar2,in_stack_fffffffffffffe90),frame_type,
                           in_stack_fffffffffffffe88,
                           (double)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  }
  *local_20 = local_64 + local_150;
  if (*local_18 < *local_20) {
    iVar1 = *local_20;
  }
  else {
    iVar1 = *local_18;
  }
  *local_20 = iVar1;
  if (local_54 == AOM_Q) {
    local_68 = local_60;
  }
  else if (((local_40->current_frame).frame_type == '\0') && (local_38->this_key_frame_forced != 0))
  {
    local_68 = local_38->last_boosted_qindex;
  }
  else {
    local_68 = av1_rc_regulate_q((AV1_COMP *)
                                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                                 in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,
                                 in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,iVar1);
    if (*local_20 < (int)local_68) {
      if (local_30->this_frame_target < local_30->max_frame_bandwidth) {
        local_68 = *local_20;
      }
      else {
        *local_20 = local_68;
      }
    }
  }
  return local_68;
}

Assistant:

static int rc_pick_q_and_bounds_no_stats(const AV1_COMP *cpi, int width,
                                         int height, int *bottom_index,
                                         int *top_index) {
  const AV1_COMMON *const cm = &cpi->common;
  const RATE_CONTROL *const rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const CurrentFrame *const current_frame = &cm->current_frame;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  const RefreshFrameInfo *const refresh_frame = &cpi->refresh_frame;
  const enum aom_rc_mode rc_mode = oxcf->rc_cfg.mode;

  assert(has_no_stats_stage(cpi));
  assert(rc_mode == AOM_VBR ||
         (!USE_UNRESTRICTED_Q_IN_CQ_MODE && rc_mode == AOM_CQ) ||
         rc_mode == AOM_Q);

  const int cq_level =
      get_active_cq_level(rc, p_rc, oxcf, frame_is_intra_only(cm),
                          cpi->superres_mode, cm->superres_scale_denominator);
  const int bit_depth = cm->seq_params->bit_depth;

  int active_best_quality;
  int active_worst_quality = calc_active_worst_quality_no_stats_vbr(cpi);
  int q;
  int *inter_minq;
  ASSIGN_MINQ_TABLE(bit_depth, inter_minq);

  if (frame_is_intra_only(cm)) {
    if (rc_mode == AOM_Q) {
      const int qindex = cq_level;
      const double q_val = av1_convert_qindex_to_q(qindex, bit_depth);
      const int delta_qindex =
          av1_compute_qdelta(rc, q_val, q_val * 0.25, bit_depth);
      active_best_quality = AOMMAX(qindex + delta_qindex, rc->best_quality);
    } else if (p_rc->this_key_frame_forced) {
#if CONFIG_FPMT_TEST
      const int simulate_parallel_frame =
          cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0 &&
          cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE;
      int qindex = simulate_parallel_frame ? p_rc->temp_last_boosted_qindex
                                           : p_rc->last_boosted_qindex;
#else
      int qindex = p_rc->last_boosted_qindex;
#endif
      const double last_boosted_q = av1_convert_qindex_to_q(qindex, bit_depth);
      const int delta_qindex = av1_compute_qdelta(
          rc, last_boosted_q, last_boosted_q * 0.75, bit_depth);
      active_best_quality = AOMMAX(qindex + delta_qindex, rc->best_quality);
    } else {  // not first frame of one pass and kf_boost is set
      double q_adj_factor = 1.0;

      active_best_quality = get_kf_active_quality(
          p_rc, p_rc->avg_frame_qindex[KEY_FRAME], bit_depth);

      // Allow somewhat lower kf minq with small image formats.
      if ((width * height) <= (352 * 288)) {
        q_adj_factor -= 0.25;
      }

      // Convert the adjustment factor to a qindex delta on active_best_quality.
      {
        const double q_val =
            av1_convert_qindex_to_q(active_best_quality, bit_depth);
        active_best_quality +=
            av1_compute_qdelta(rc, q_val, q_val * q_adj_factor, bit_depth);
      }
    }
  } else if (!rc->is_src_frame_alt_ref &&
             (refresh_frame->golden_frame || refresh_frame->alt_ref_frame)) {
    // Use the lower of active_worst_quality and recent
    // average Q as basis for GF/ARF best Q limit unless last frame was
    // a key frame.
    q = (rc->frames_since_key > 1 &&
         p_rc->avg_frame_qindex[INTER_FRAME] < active_worst_quality)
            ? p_rc->avg_frame_qindex[INTER_FRAME]
            : p_rc->avg_frame_qindex[KEY_FRAME];
    // For constrained quality don't allow Q less than the cq level
    if (rc_mode == AOM_CQ) {
      if (q < cq_level) q = cq_level;
      active_best_quality = get_gf_active_quality(p_rc, q, bit_depth);
      // Constrained quality use slightly lower active best.
      active_best_quality = active_best_quality * 15 / 16;
    } else if (rc_mode == AOM_Q) {
      const int qindex = cq_level;
      const double q_val = av1_convert_qindex_to_q(qindex, bit_depth);
      const int delta_qindex =
          (refresh_frame->alt_ref_frame)
              ? av1_compute_qdelta(rc, q_val, q_val * 0.40, bit_depth)
              : av1_compute_qdelta(rc, q_val, q_val * 0.50, bit_depth);
      active_best_quality = AOMMAX(qindex + delta_qindex, rc->best_quality);
    } else {
      active_best_quality = get_gf_active_quality(p_rc, q, bit_depth);
    }
  } else {
    if (rc_mode == AOM_Q) {
      const int qindex = cq_level;
      const double q_val = av1_convert_qindex_to_q(qindex, bit_depth);
      const double delta_rate[FIXED_GF_INTERVAL] = { 0.50, 1.0, 0.85, 1.0,
                                                     0.70, 1.0, 0.85, 1.0 };
      const int delta_qindex = av1_compute_qdelta(
          rc, q_val,
          q_val * delta_rate[current_frame->frame_number % FIXED_GF_INTERVAL],
          bit_depth);
      active_best_quality = AOMMAX(qindex + delta_qindex, rc->best_quality);
    } else {
      // Use the lower of active_worst_quality and recent/average Q.
      active_best_quality =
          (current_frame->frame_number > 1)
              ? inter_minq[p_rc->avg_frame_qindex[INTER_FRAME]]
              : inter_minq[p_rc->avg_frame_qindex[KEY_FRAME]];
      // For the constrained quality mode we don't want
      // q to fall below the cq level.
      if ((rc_mode == AOM_CQ) && (active_best_quality < cq_level)) {
        active_best_quality = cq_level;
      }
    }
  }

  // Clip the active best and worst quality values to limits
  active_best_quality =
      clamp(active_best_quality, rc->best_quality, rc->worst_quality);
  active_worst_quality =
      clamp(active_worst_quality, active_best_quality, rc->worst_quality);

  *top_index = active_worst_quality;
  *bottom_index = active_best_quality;

  // Limit Q range for the adaptive loop.
  {
    int qdelta = 0;
    if (current_frame->frame_type == KEY_FRAME &&
        !p_rc->this_key_frame_forced && current_frame->frame_number != 0) {
      qdelta = av1_compute_qdelta_by_rate(cpi, current_frame->frame_type,
                                          active_worst_quality, 2.0);
    } else if (!rc->is_src_frame_alt_ref &&
               (refresh_frame->golden_frame || refresh_frame->alt_ref_frame)) {
      qdelta = av1_compute_qdelta_by_rate(cpi, current_frame->frame_type,
                                          active_worst_quality, 1.75);
    }
    *top_index = active_worst_quality + qdelta;
    *top_index = AOMMAX(*top_index, *bottom_index);
  }

  if (rc_mode == AOM_Q) {
    q = active_best_quality;
    // Special case code to try and match quality with forced key frames
  } else if ((current_frame->frame_type == KEY_FRAME) &&
             p_rc->this_key_frame_forced) {
#if CONFIG_FPMT_TEST
    const int simulate_parallel_frame =
        cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0 &&
        cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE;
    q = simulate_parallel_frame ? p_rc->temp_last_boosted_qindex
                                : p_rc->last_boosted_qindex;
#else
    q = p_rc->last_boosted_qindex;
#endif
  } else {
    q = av1_rc_regulate_q(cpi, rc->this_frame_target, active_best_quality,
                          active_worst_quality, width, height);
    if (q > *top_index) {
      // Special case when we are targeting the max allowed rate
      if (rc->this_frame_target >= rc->max_frame_bandwidth)
        *top_index = q;
      else
        q = *top_index;
    }
  }

  assert(*top_index <= rc->worst_quality && *top_index >= rc->best_quality);
  assert(*bottom_index <= rc->worst_quality &&
         *bottom_index >= rc->best_quality);
  assert(q <= rc->worst_quality && q >= rc->best_quality);
  return q;
}